

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O0

void __thiscall
SGParser::Parse<SGParser::Generator::StdGrammarStackElement>::Destroy
          (Parse<SGParser::Generator::StdGrammarStackElement> *this)

{
  StdGrammarStackElement *pSVar1;
  unsigned_long *puVar2;
  void *local_20;
  void *local_18;
  Parse<SGParser::Generator::StdGrammarStackElement> *local_10;
  Parse<SGParser::Generator::StdGrammarStackElement> *this_local;
  
  local_10 = this;
  CleanupParseStack(this,0);
  local_18 = (void *)0x0;
  pSVar1 = std::exchange<SGParser::Generator::StdGrammarStackElement*,decltype(nullptr)>
                     (&this->pStack,&local_18);
  if (pSVar1 != (StdGrammarStackElement *)0x0) {
    operator_delete__(pSVar1);
  }
  local_20 = (void *)0x0;
  puVar2 = std::exchange<unsigned_long*,decltype(nullptr)>
                     (&this->pValidTokenStackPositions,&local_20);
  if (puVar2 != (unsigned_long *)0x0) {
    operator_delete__(puVar2);
  }
  this->TopState = 0xffffffff;
  return;
}

Assistant:

void Parse<StackElement>::Destroy() {
    // Delete the parse stack
    CleanupParseStack();

    delete[] std::exchange(pStack, nullptr);
    delete[] std::exchange(pValidTokenStackPositions, nullptr);

    TopState = InvalidState;
}